

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::RangeSink::AddVMRange
          (RangeSink *this,char *analyzer,uint64_t vmaddr,uint64_t vmsize,string *name)

{
  pointer ppVar1;
  bool verbose;
  bool bVar2;
  char *pcVar3;
  Nonnull<char_*> pcVar4;
  pointer ppVar5;
  size_t num_args;
  string_view name_00;
  string_view format;
  string label;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  RangeSink *local_f0;
  string local_e8;
  long local_c8;
  Nonnull<char_*> pcStack_c0;
  long local_b8;
  Nonnull<char_*> local_b0;
  size_type local_a8;
  pointer local_a0;
  long local_90;
  Nonnull<char_*> pcStack_88;
  char local_80 [32];
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  verbose = IsVerboseForVMRange(this,vmaddr,vmsize);
  if (verbose) {
    pcVar3 = GetDataSourceLabel(this->data_source_);
    printf("[%s, %s] AddVMRange(%.*s, %lx, %lx)\n",pcVar3,analyzer,
           (ulong)(uint)name->_M_string_length,(name->_M_dataplus)._M_p,vmaddr,vmsize);
  }
  if (this->translator_ == (DualMap *)0x0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x50a,
                  "void bloaty::RangeSink::AddVMRange(const char *, uint64_t, uint64_t, const std::string &)"
                 );
  }
  ppVar5 = (this->outputs_).
           super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->outputs_).
           super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    local_f0 = this;
    do {
      name_00._M_str = (name->_M_dataplus)._M_p;
      name_00._M_len = name->_M_string_length;
      NameMunger::Munge_abi_cxx11_(&local_e8,ppVar5->second,name_00);
      num_args = (size_t)verbose;
      bVar2 = RangeMap::AddRangeWithTranslation
                        (&ppVar5->first->vm_map,vmaddr,vmsize,&local_e8,
                         &local_f0->translator_->vm_map,verbose,&ppVar5->first->file_map);
      if (!bVar2 && 0 < verbose_level) {
        pcVar4 = absl::numbers_internal::FastIntToBuffer(vmaddr,local_80);
        local_90 = (long)pcVar4 - (long)local_80;
        pcStack_88 = local_80;
        pcVar4 = absl::numbers_internal::FastIntToBuffer(vmsize,local_50);
        local_b8 = (long)pcVar4 - (long)local_50;
        local_a0 = (name->_M_dataplus)._M_p;
        local_a8 = name->_M_string_length;
        local_108 = 0;
        local_100 = 0;
        local_c8 = local_90;
        pcStack_c0 = pcStack_88;
        format._M_str = (char *)&local_c8;
        format._M_len = (size_t)"VM range ($0, $1) for label $2 extends beyond base map";
        local_110 = &local_100;
        local_b0 = local_50;
        local_60 = local_b8;
        local_58 = local_50;
        absl::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)&local_110,(Nonnull<std::string_*>)0x36,format,
                   (Nullable<const_absl::string_view_*>)0x3,num_args);
        printf("WARNING: %s\n",local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  return;
}

Assistant:

void RangeSink::AddVMRange(const char* analyzer, uint64_t vmaddr,
                           uint64_t vmsize, const std::string& name) {
  bool verbose = IsVerboseForVMRange(vmaddr, vmsize);
  if (verbose) {
    printf("[%s, %s] AddVMRange(%.*s, %" PRIx64 ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), vmaddr, vmsize);
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    bool ok = pair.first->vm_map.AddRangeWithTranslation(
        vmaddr, vmsize, label, translator_->vm_map, verbose,
        &pair.first->file_map);
    if (!ok) {
      WARN("VM range ($0, $1) for label $2 extends beyond base map", vmaddr,
           vmsize, name);
    }
  }
}